

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTable::childCount(QAccessibleTable *this)

{
  int iVar1;
  int iVar2;
  QAbstractItemView *pQVar3;
  QAccessibleTable *this_00;
  QHeaderView *pQVar4;
  QHeaderView *pQVar5;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  int hHeader;
  int vHeader;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex rootIndex;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = view((QAccessibleTable *)0x7f588a);
  if (pQVar3 == (QAbstractItemView *)0x0) {
    local_24 = 0;
  }
  else {
    this_00 = (QAccessibleTable *)QAbstractItemView::model(in_stack_ffffffffffffffc0);
    if (this_00 == (QAccessibleTable *)0x0) {
      local_24 = 0;
    }
    else {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::rootIndex((QAbstractItemView *)in_RDI);
      pQVar4 = verticalHeader(in_RDI);
      pQVar5 = horizontalHeader(this_00);
      iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,&local_20);
      iVar2 = (**(code **)(*(long *)in_RDI + 0x58))();
      local_24 = (iVar1 + (uint)(pQVar5 != (QHeaderView *)0x0)) *
                 (iVar2 + (uint)(pQVar4 != (QHeaderView *)0x0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleTable::childCount() const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return 0;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return 0;
    const QModelIndex rootIndex = theView->rootIndex();
    int vHeader = verticalHeader() ? 1 : 0;
    int hHeader = horizontalHeader() ? 1 : 0;
    return (theModel->rowCount(rootIndex) + hHeader) * (columnCount() + vHeader);
}